

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVehicle.cpp
# Opt level: O2

void __thiscall
OpenSteer::SimpleVehicle::annotationVelocityAcceleration
          (SimpleVehicle *this,float maxLengthA,float maxLengthV)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar1;
  float fVar2;
  float fVar3;
  Vec3 VVar4;
  Color vColor;
  Color aColor;
  Vec3 local_78;
  float local_68;
  float fStack_64;
  Vec3 local_58;
  Color local_48;
  Color local_38;
  
  (*(this->super_SimpleVehicle_3).
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1e])();
  (*(this->super_SimpleVehicle_3).
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])(this);
  fVar1 = maxLengthV / extraout_XMM0_Da_00;
  fVar2 = fVar1;
  (*(this->super_SimpleVehicle_3).
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  local_68 = extraout_XMM0_Da_01;
  fStack_64 = extraout_XMM0_Db;
  local_58.z = fVar2;
  local_58.x = extraout_XMM0_Da_01;
  local_58.y = extraout_XMM0_Db;
  Color::Color(&local_38,0.4,0.4,1.0,1.0);
  fVar3 = 0.4;
  Color::Color(&local_48,1.0,0.4,1.0,1.0);
  (*(this->super_SimpleVehicle_3).
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1a])(this);
  local_78.x = fVar1 * extraout_XMM0_Da_02 + local_68;
  local_78.y = fVar1 * extraout_XMM0_Db_00 + fStack_64;
  local_78.z = fVar3 * fVar1 + fVar2;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::annotationLine
            ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
             &local_58,&local_78,&local_48);
  VVar4 = Vec3::operator*(&this->_smoothedAcceleration,maxLengthA / extraout_XMM0_Da);
  local_78.x = local_58.x + VVar4.x;
  local_78.y = local_58.y + VVar4.y;
  local_78.z = VVar4.z + local_58.z;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::annotationLine
            ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
             &local_58,&local_78,&local_38);
  return;
}

Assistant:

void 
OpenSteer::SimpleVehicle::annotationVelocityAcceleration (float maxLengthA, 
                                                          float maxLengthV)
{
    const float desat = 0.4f;
    const float aScale = maxLengthA / maxForce ();
    const float vScale = maxLengthV / maxSpeed ();
    const Vec3& p = position();
    const Color aColor (desat, desat, 1); // bluish
    const Color vColor (    1, desat, 1); // pinkish

    annotationLine (p, p + (velocity ()           * vScale), vColor);
    annotationLine (p, p + (_smoothedAcceleration * aScale), aColor);
}